

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<ProString>::reserve(QList<ProString> *this,qsizetype asize)

{
  bool bVar1;
  Int IVar2;
  QArrayDataPointer<ProString> *this_00;
  qsizetype qVar3;
  ProString *e;
  ProString *b;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<ProString> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<ProString> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<ProString> *in_stack_ffffffffffffff80;
  QArrayDataPointer<ProString> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QGenericArrayOps<ProString> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<ProString> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QArrayDataPointer<ProString> *)capacity((QList<ProString> *)0x114d0f);
  qVar3 = QArrayDataPointer<ProString>::freeSpaceAtBegin(in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)this_00 - qVar3) {
    QArrayDataPointer<ProString>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<ProString>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar2 != 0) goto LAB_00114eb2;
    QArrayDataPointer<ProString>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<ProString>::isShared(in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<ProString>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<ProString>::setFlag
                ((QArrayDataPointer<ProString> *)0x114db6,(ArrayOptions)f.i);
      goto LAB_00114eb2;
    }
  }
  local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_38.size = -0x5555555555555556;
  local_40 = size((QList<ProString> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<ProString>::QArrayDataPointer
            (this_00,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  e = (ProString *)QArrayDataPointer<ProString>::operator->(&local_38);
  QArrayDataPointer<ProString>::operator->(in_RDI);
  b = QArrayDataPointer<ProString>::begin((QArrayDataPointer<ProString> *)0x114e36);
  QArrayDataPointer<ProString>::operator->(in_RDI);
  QArrayDataPointer<ProString>::end((QArrayDataPointer<ProString> *)e);
  QtPrivate::QGenericArrayOps<ProString>::copyAppend(in_stack_ffffffffffffff90,b,e);
  pDVar4 = QArrayDataPointer<ProString>::d_ptr(&local_38);
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<ProString> *)QArrayDataPointer<ProString>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)e,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<ProString>::setFlag
              ((QArrayDataPointer<ProString> *)0x114e99,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<ProString>::swap((QArrayDataPointer<ProString> *)e,in_stack_ffffffffffffff78);
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)e);
LAB_00114eb2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}